

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bassign(bstring a,bstring b)

{
  int len;
  int iVar1;
  uchar *puVar2;
  long lVar3;
  
  iVar1 = -1;
  if ((b != (bstring)0x0) && (b->data != (uchar *)0x0)) {
    len = b->slen;
    if (-1 < len) {
      if (len == 0) {
        if (a == (bstring)0x0) {
          return -1;
        }
        puVar2 = a->data;
        if (puVar2 == (uchar *)0x0) {
          return -1;
        }
        if (a->mlen == 0) {
          return -1;
        }
        if (a->mlen < a->slen) {
          return -1;
        }
        if (a->slen < 0) {
          return -1;
        }
        lVar3 = 0;
      }
      else {
        iVar1 = balloc(a,len);
        if (iVar1 != 0) {
          return -1;
        }
        memmove(a->data,b->data,(long)b->slen);
        puVar2 = a->data;
        lVar3 = (long)b->slen;
      }
      puVar2[lVar3] = '\0';
      a->slen = b->slen;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int bassign (bstring a, const bstring b) {
	if (b == NULL || b->data == NULL || b->slen < 0 ) 
		return BSTR_ERR;
	if (b->slen != 0) {
		if (balloc (a, b->slen) != BSTR_OK) return BSTR_ERR;
		bstr__memmove (a->data, b->data, b->slen);
	} else {
		if (a == NULL || a->data == NULL || a->mlen < a->slen || 
		    a->slen < 0 || a->mlen == 0) 
			return BSTR_ERR;
	}
	a->data[b->slen] = (unsigned char) '\0';
	a->slen = b->slen;
	return BSTR_OK;
}